

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  int iVar3;
  UnknownField *this;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  int i;
  int index;
  
  index = 0;
  sVar6 = 0;
  while( true ) {
    pvVar1 = unknown_fields->fields_;
    iVar3 = 0;
    if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      iVar3 = (int)((ulong)((long)(pvVar1->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar3 <= index) break;
    this = UnknownFieldSet::field(unknown_fields,index);
    if (this->type_ == 3) {
      uVar5 = this->number_ | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = UnknownField::GetLengthDelimitedSize(this);
      uVar5 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = (long)(int)(uint)sVar4 + sVar6 + 4 + (ulong)(iVar2 * 9 + 0x49U >> 6) +
              (ulong)(iVar3 * 9 + 0x49U >> 6);
    }
    index = index + 1;
  }
  return sVar6;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}